

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalNinjaGenerator::OpenRulesFileStream(cmGlobalNinjaGenerator *this)

{
  char *pcVar1;
  cmGeneratedFileStream *pcVar2;
  size_t sVar3;
  string rulesFilePath;
  allocator local_31;
  long *local_30 [2];
  long local_20 [2];
  
  pcVar1 = cmake::GetHomeOutputDirectory((this->super_cmGlobalGenerator).CMakeInstance);
  std::__cxx11::string::string((string *)local_30,pcVar1,&local_31);
  std::__cxx11::string::append((char *)local_30);
  std::__cxx11::string::append((char *)local_30);
  if (this->RulesFileStream == (cmGeneratedFileStream *)0x0) {
    pcVar2 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(pcVar2,(char *)local_30[0],false);
    this->RulesFileStream = pcVar2;
  }
  WriteDisclaimer(this,(ostream *)this->RulesFileStream);
  pcVar2 = this->RulesFileStream;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar2,"# This file contains all the rules used to get the outputs files\n",
             0x41);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar2,"# built from the input files.\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar2,"# It is included in the main \'",0x1e);
  pcVar1 = NINJA_BUILD_FILE;
  if (NINJA_BUILD_FILE == (char *)0x0) {
    std::ios::clear((int)pcVar2 +
                    (int)(pcVar2->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>
                         ._vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(NINJA_BUILD_FILE);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,"\'.\n\n",4);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::OpenRulesFileStream()
{
  // Compute Ninja's build file path.
  std::string rulesFilePath =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  rulesFilePath += "/";
  rulesFilePath += cmGlobalNinjaGenerator::NINJA_RULES_FILE;

  // Get a stream where to generate things.
  if (!this->RulesFileStream)
    {
    this->RulesFileStream = new cmGeneratedFileStream(rulesFilePath.c_str());
    if (!this->RulesFileStream)
      {
      // An error message is generated by the constructor if it cannot
      // open the file.
      return;
      }
    }

  // Write the do not edit header.
  this->WriteDisclaimer(*this->RulesFileStream);

  // Write comment about this file.
  *this->RulesFileStream
    << "# This file contains all the rules used to get the outputs files\n"
    << "# built from the input files.\n"
    << "# It is included in the main '" << NINJA_BUILD_FILE << "'.\n\n"
    ;
}